

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

int __thiscall
drace::detector::Fasttrack<std::shared_mutex>::init
          (Fasttrack<std::shared_mutex> *this,EVP_PKEY_CTX *ctx)

{
  Callback in_RCX;
  char **in_RDX;
  void *in_R8;
  void *context_local;
  Callback rc_clb_local;
  char **argv_local;
  int argc_local;
  Fasttrack<std::shared_mutex> *this_local;
  
  parse_args(this,(int)ctx,in_RDX);
  this->clb = in_RCX;
  this->clb_context = in_R8;
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

bool init(int argc, const char** argv, Callback rc_clb, void* context) final {
    parse_args(argc, argv);
    clb = rc_clb;  // init callback
    clb_context = context;
    return true;
  }